

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16_test.c
# Opt level: O0

bool_t u16Test(void)

{
  u16 uVar1;
  uint uVar2;
  bool_t bVar3;
  size_t sVar4;
  octet b [4];
  u16 a [2];
  u16 w;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined6 in_stack_fffffffffffffff0;
  short sVar5;
  
  sVar5 = 0x102;
  uVar1 = u16Rev(0x102);
  if ((uVar1 == 0x201) && (uVar1 = u16Rev(0x201), uVar1 == 0x102)) {
    u16Rev2((u16 *)CONCAT26(sVar5,in_stack_fffffffffffffff0),
            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    u16Rev2((u16 *)CONCAT26(sVar5,in_stack_fffffffffffffff0),
            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (sVar5 == 0x102) {
      uVar2 = 0x201;
      uVar1 = u16Rev(0x102);
      if ((uVar2 == uVar1) && (uVar1 = u16Bitrev(0x102), uVar1 == 0x4080)) {
        uVar1 = u16Bitrev(0x102);
        uVar1 = u16Bitrev(uVar1);
        if ((((uVar1 == 0x102) &&
             (((((sVar4 = u16Weight(0), sVar4 == 0 && (bVar3 = u16Parity(0), bVar3 == 0)) &&
                (bVar3 = u16Parity(1), bVar3 != 0)) &&
               ((sVar4 = u16Weight(0xa001), sVar4 == 3 && (bVar3 = u16Parity(0xa001), bVar3 != 0))))
              && (sVar4 = u16Weight(0xffff), sVar4 == 0x10)))) &&
            (((((bVar3 = u16Parity(0xffff), bVar3 == 0 && (sVar4 = u16Weight(0xfff8), sVar4 == 0xd))
               && (sVar4 = u16CTZ(0), sVar4 == 0x10)) &&
              (((sVar4 = u16CTZ_fast(0), sVar4 == 0x10 && (sVar4 = u16CLZ(0), sVar4 == 0x10)) &&
               (sVar4 = u16CLZ_fast(0), sVar4 == 0x10)))) &&
             ((sVar4 = u16CTZ(0), sVar4 == 0 && (sVar4 = u16CTZ_fast(1), sVar4 == 0)))))) &&
           (((sVar4 = u16CLZ(0), sVar4 == 0xf &&
             ((sVar4 = u16CLZ_fast(1), sVar4 == 0xf && (sVar4 = u16CTZ(0), sVar4 == 3)))) &&
            (((sVar4 = u16CTZ_fast(0xfff8), sVar4 == 3 &&
              ((((sVar4 = u16CLZ(0), sVar4 == 0 && (sVar4 = u16CLZ_fast(0xfff8), sVar4 == 0)) &&
                (uVar1 = u16Deshuffle(0), uVar1 == 0)) &&
               ((uVar1 = u16Deshuffle(1), uVar1 == 1 && (uVar1 = u16Deshuffle(2), uVar1 == 0x100))))
              )) && (uVar1 = u16Deshuffle(0xaaaa), uVar1 == 0xff00)))))) {
          uVar1 = u16Deshuffle(0x3210);
          uVar1 = u16Shuffle(uVar1);
          if (uVar1 == 0x3210) {
            uVar1 = u16Shuffle(0xdcba);
            uVar1 = u16Deshuffle(uVar1);
            if (((uVar1 == 0xdcba) && (uVar1 = u16NegInv(1), uVar1 == 0xffff)) &&
               ((uVar1 = u16NegInv(5), uVar1 == 0x3333 && (uVar1 = u16NegInv(0x3333), uVar1 == 5))))
            {
              u16To((void *)CONCAT26(sVar5,in_stack_fffffffffffffff0),
                    CONCAT44(uVar2,in_stack_ffffffffffffffe8),(u16 *)0x106be7);
              u16From((u16 *)CONCAT26(sVar5,in_stack_fffffffffffffff0),
                      (void *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),0x106bfb);
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

bool_t u16Test()
{
	u16 w = 0x0102;
	u16 a[2] = {0x0102, 0x0201};
	octet b[4];
	// rot
	if (u16RotHi(w, 1) != 0x0204 ||
		u16RotHi(w, 4) != 0x1020 ||
		u16RotHi(w, 8) != 0x0201 ||
		u16RotLo(u16RotHi(w, 7), 7) != w ||
		u16RotLo(u16RotHi(w, 9), 9) != w ||
		u16RotLo(u16RotHi(w, 13), 13) != w)
		return FALSE;
	// reverse
	if (u16Rev(w) != a[1] || u16Rev(a[1]) != w)
		return FALSE;
	u16Rev2(a, 2), u16Rev2(a, 2);
	if (a[0] != w || a[1] != u16Rev(w))
		return FALSE;
	// bit reverse
	if (u16Bitrev(w) != 0x4080|| u16Bitrev(u16Bitrev(w)) != w)
		return FALSE;
	// weight / parity
	if (u16Weight(0) != 0 || u16Parity(0) || !u16Parity(1) ||
		u16Weight(0xA001) != 3 || !u16Parity(0xA001) ||
		u16Weight(0xFFFF) != 16 || u16Parity(0xFFFF) ||
		u16Weight(0xFFF8) != 13)
		return FALSE;
	// CTZ / CLZ
	if (SAFE(u16CTZ)(0) != 16 || FAST(u16CTZ)(0) != 16 ||
		SAFE(u16CLZ)(0) != 16 || FAST(u16CLZ)(0) != 16 ||
		SAFE(u16CTZ)(1) != 0 || FAST(u16CTZ)(1) != 0 ||
		SAFE(u16CLZ)(1) != 15 || FAST(u16CLZ)(1) != 15 ||
		SAFE(u16CTZ)(0xFFF8) != 3 || FAST(u16CTZ)(0xFFF8) != 3 ||
		SAFE(u16CLZ)(0xFFF8) != 0 || FAST(u16CLZ)(0xFFF8) != 0
		)
		return FALSE;
	// shuffle
	if (u16Deshuffle(0) != 0 || u16Deshuffle(1) != 1 ||
		u16Deshuffle(2) != 0x0100 ||
		u16Deshuffle(0xAAAA) != 0xFF00 || 
		u16Shuffle(u16Deshuffle(0x3210)) != 0x3210 ||
		u16Deshuffle(u16Shuffle(0xDCBA)) != 0xDCBA)
		return FALSE;
	// negInv
	if (u16NegInv(1) != U16_MAX ||
		u16NegInv(5) != 13107 || u16NegInv(13107) != 5)
		return FALSE;
	// from / to
	u16To(b, 3, a), u16From(a, b, 3);
	if (a[0] != w || a[1] != 0x0001)
		return FALSE;
	// все нормально
	return TRUE;
}